

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objfile.c
# Opt level: O3

section_entry_t * read_section_entry(void)

{
  int iVar1;
  section_type_t sVar2;
  section_entry_t *psVar3;
  uchar *dest;
  
  psVar3 = (section_entry_t *)mmalloc(0x20);
  iVar1 = read_int32();
  psVar3->id = iVar1;
  sVar2 = read_int32();
  psVar3->type = sVar2;
  iVar1 = read_int16();
  psVar3->offset = iVar1;
  iVar1 = read_int32();
  psVar3->bank_num = iVar1;
  iVar1 = read_int32();
  psVar3->data_size = iVar1;
  if (psVar3->type != org) {
    err(F,"invalid object file: unknown section type");
    iVar1 = psVar3->data_size;
  }
  dest = (uchar *)mmalloc((long)iVar1);
  psVar3->data = dest;
  read_data(dest,(long)psVar3->data_size);
  return psVar3;
}

Assistant:

section_entry_t* read_section_entry()
{
    section_entry_t* sect = (section_entry_t*)mmalloc(sizeof(section_entry_t));
    sect->id = read_int32();
    sect->type = read_int32();
    sect->offset = read_int16();
    sect->bank_num = read_int32();
    sect->data_size = read_int32();
    if (sect->type < org || sect->type > org)
        err(F, "invalid object file: unknown section type");
    sect->data = (unsigned char*)mmalloc(sect->data_size);
    read_data(sect->data, sect->data_size);
    return sect;
}